

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

uint32_t hash(HTItemKey key,HTKeyType type)

{
  size_t length;
  ObjString *string;
  uint32_t uStack_20;
  HTKeyType type_local;
  HTItemKey key_local;
  
  string = (ObjString *)key.field_0.key_ident_string;
  switch(type) {
  case HT_KEY_OBJSTRING:
    key_local.field_0.ident_length._4_4_ = hash_string_obj(string);
    break;
  case HT_KEY_CSTRING:
    length = strlen((char *)string);
    key_local.field_0.ident_length._4_4_ = hash_string((char *)string,length);
    break;
  case HT_KEY_INT:
    uStack_20 = key.key_int;
    key_local.field_0.ident_length._4_4_ = hash_uint32_t(uStack_20);
    break;
  case HT_KEY_IDENT_STRING:
    key_local.field_0.ident_length._4_4_ = hash_string((char *)string,key.field_0.ident_length);
    break;
  default:
    key_local.field_0.ident_length._4_4_ = 0;
  }
  return key_local.field_0.ident_length._4_4_;
}

Assistant:

uint32_t hash(HTItemKey key, HTKeyType type) {
    switch (type) {
        case HT_KEY_CSTRING:
            return hash_string(key.key_c_string, strlen(key.key_c_string));
        case HT_KEY_OBJSTRING:
            return hash_string_obj(key.key_obj_string);
        case HT_KEY_INT:
            return hash_uint32_t(key.key_int);
        case HT_KEY_IDENT_STRING:
            return hash_string(key.key_ident_string, key.ident_length);
    }

    return 0;
}